

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_portal.cpp
# Opt level: O2

void GLPortal::EndFrame(void)

{
  GLPortal *this;
  bool bVar1;
  uint uVar2;
  FString FVar3;
  int iVar4;
  undefined4 extraout_var;
  uint uVar5;
  
  if (gl_portalinfo == 1) {
    Printf("%s%d portals, depth = %d\n%s{\n",indent.Chars,(ulong)portals.Count,
           (ulong)(uint)renderdepth,indent.Chars);
    FString::operator+=(&indent,"  ");
  }
  uVar2 = portals.Count;
  uVar5 = renderdepth + 2;
  bVar1 = uVar5 < portals.Count;
  do {
    FVar3.Chars = indent.Chars;
    iVar4 = renderdepth;
    if (portals.Count == 0) {
      renderdepth = renderdepth + -1;
      if (gl_portalinfo != 0) {
LAB_003fb607:
        renderdepth = iVar4 + -1;
        FString::Truncate(&indent,(ulong)*(uint *)(indent.Chars + -0xc) - 2);
        Printf("%s}\n",indent.Chars);
        if (portals.Count == 0) {
          gl_portalinfo = 0;
        }
      }
      return;
    }
    portals.Count = portals.Count - 1;
    this = portals.Array[portals.Count];
    if (this == (GLPortal *)0x0) {
      renderdepth = renderdepth + -1;
      if ((gl_portalinfo & 1) == 0) {
        return;
      }
      goto LAB_003fb607;
    }
    if ((gl_portalinfo & 1) != 0) {
      iVar4 = (*this->_vptr_GLPortal[7])(this);
      Printf("%sProcessing %s, depth = %d, query = %d\n",FVar3.Chars,CONCAT44(extraout_var,iVar4),
             (ulong)(uint)renderdepth,(ulong)bVar1);
    }
    if ((this->lines).Count != 0) {
      RenderPortal(this,true,uVar5 < uVar2);
    }
    (*this->_vptr_GLPortal[1])(this);
  } while( true );
}

Assistant:

void GLPortal::EndFrame()
{
	GLPortal * p;

	if (gl_portalinfo)
	{
		Printf("%s%d portals, depth = %d\n%s{\n", indent.GetChars(), portals.Size(), renderdepth, indent.GetChars());
		indent += "  ";
	}

	// Only use occlusion query if there are more than 2 portals. 
	// Otherwise there's too much overhead.
	// (And don't forget to consider the separating NULL pointers!)
	bool usequery = portals.Size() > 2 + (unsigned)renderdepth;

	while (portals.Pop(p) && p)
	{
		if (gl_portalinfo) 
		{
			Printf("%sProcessing %s, depth = %d, query = %d\n", indent.GetChars(), p->GetName(), renderdepth, usequery);
		}
		if (p->lines.Size() > 0)
		{
			p->RenderPortal(true, usequery);
		}
		delete p;
	}
	renderdepth--;

	if (gl_portalinfo)
	{
		indent.Truncate(long(indent.Len()-2));
		Printf("%s}\n", indent.GetChars());
		if (portals.Size() == 0) gl_portalinfo = false;
	}
}